

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_tunnel_linux.c
# Opt level: O1

int os_tunnel_linux_add(os_tunnel *tunnel)

{
  int iVar1;
  uint uVar2;
  
  if (((tunnel->_node).list.next == (list_entity *)0x0) ||
     (iVar1 = -1, (tunnel->_node).list.prev == (list_entity *)0x0)) {
    iVar1 = _handle_tunnel(tunnel,true);
    uVar2 = 0;
    if (iVar1 == 0) {
      (tunnel->_node).key = tunnel;
      avl_insert(&_tunnel_tree,&tunnel->_node);
      uVar2 = if_nametoindex((char *)tunnel);
    }
    tunnel->if_index = uVar2;
  }
  return iVar1;
}

Assistant:

int
os_tunnel_linux_add(struct os_tunnel *tunnel) {
  int result;

  if (avl_is_node_added(&tunnel->_node)) {
    return -1;
  }

  result = _handle_tunnel(tunnel, true);
  if (!result) {
    tunnel->_node.key = tunnel->p.tunnel_if;
    avl_insert(&_tunnel_tree, &tunnel->_node);

    tunnel->if_index = if_nametoindex(tunnel->p.tunnel_if);
  }
  else {
    tunnel->if_index = 0;
  }
  return result;
}